

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdConvert<wabt::interp::Simd<double,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)4>,true>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  
  VVar2 = Pop(this);
  auVar1._0_8_ = VVar2.field_0.i64_ & 0xffffffff;
  auVar1._8_4_ = VVar2.field_0._4_4_;
  auVar1._12_4_ = 0;
  VVar2.field_0._8_8_ = SUB168(auVar1 | _DAT_001aa840,8) - DAT_001aa840._8_8_;
  VVar2.field_0.f64_ = (f64)(SUB168(auVar1 | _DAT_001aa840,0) - (double)DAT_001aa840);
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdConvert() {
  using SL = typename S::LaneType;
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = Convert<SL>(val[(low ? 0 : S::lanes) + i]);
  }
  Push(result);
  return RunResult::Ok;
}